

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData * GenerateLogoProfTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  pointer pSVar1;
  bool bVar2;
  BitBuffer *bitstream;
  Sector *sector;
  pointer sector_00;
  BitstreamTrackBuilder bitbuf;
  
  bVar2 = IsLogoProfTrack(track);
  if (bVar2) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,MFM);
    TrackBuilder::addTrackStart(&bitbuf.super_TrackBuilder,false);
    TrackBuilder::addGap(&bitbuf.super_TrackBuilder,600,-1);
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (sector_00 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                     super__Vector_impl_data._M_start; sector_00 != pSVar1;
        sector_00 = sector_00 + 1) {
      if ((sector_00->header).sector != 1) {
        TrackBuilder::addSector(&bitbuf.super_TrackBuilder,sector_00,0x20);
      }
    }
    bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    BitBuffer::~BitBuffer(&bitbuf.m_buffer);
    return __return_storage_ptr__;
  }
  __assert_fail("IsLogoProfTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x251,"TrackData GenerateLogoProfTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateLogoProfTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsLogoProfTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();
    bitbuf.addGap(600);

    for (auto& sector : track)
    {
        if (sector.header.sector != 1)
            bitbuf.addSector(sector, 0x20);
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}